

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_module * lys_implemented_module(lys_module *mod)

{
  lys_module *plVar1;
  long lVar2;
  long lVar3;
  
  if (mod == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  if ((mod->field_0x40 & 0x80) == 0) {
    lVar2 = (long)(mod->ctx->models).used;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        plVar1 = (mod->ctx->models).list[lVar3];
        if (((plVar1->field_0x40 & 0x80) != 0) && (mod->name == plVar1->name)) {
          return plVar1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    return mod;
  }
  return mod;
}

Assistant:

lys_module *
lys_implemented_module(const struct lys_module *mod)
{
    struct ly_ctx *ctx;
    int i;

    if (!mod || mod->implemented) {
        /* invalid argument or the module itself is implemented */
        return (struct lys_module *)mod;
    }

    ctx = mod->ctx;
    for (i = 0; i < ctx->models.used; i++) {
        if (!ctx->models.list[i]->implemented) {
            continue;
        }

        if (ly_strequal(mod->name, ctx->models.list[i]->name, 1)) {
            /* we have some revision of the module implemented */
            return ctx->models.list[i];
        }
    }

    /* we have no revision of the module implemented, return the module itself,
     * it is up to the caller to set the module implemented when needed */
    return (struct lys_module *)mod;
}